

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.hpp
# Opt level: O3

difference_t type_safe::operator-(index_t *lhs,index_t *rhs)

{
  integer_type_conflict1 iVar1;
  integer_type_conflict1 iVar2;
  source_location local_10;
  
  iVar1 = (lhs->
          super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
          ).value_.value_;
  if ((-1 < (long)iVar1) &&
     (iVar2 = (rhs->
              super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
              ).value_.value_, -1 < (long)iVar2)) {
    return (difference_t)(iVar1 - iVar2);
  }
  local_10.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
  ;
  local_10.line_number = 0x167;
  debug_assert::default_handler::handle(&local_10,"","conversion would overflow");
  abort();
}

Assistant:

constexpr difference_t operator-(const index_t& lhs, const index_t& rhs) noexcept
{
    return difference_t(make_signed(get(lhs)) - make_signed(get(rhs)));
}